

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O0

uint s2coding::GetUintWithLength<unsigned_int>(char *ptr,int length)

{
  ostream *poVar1;
  char *pcVar2;
  bool local_49;
  uint local_48;
  uint x;
  S2LogMessage local_30;
  S2LogMessageVoidify local_1d;
  int local_1c;
  char *pcStack_18;
  int length_local;
  char *ptr_local;
  
  local_49 = (uint)length < 5;
  if (local_49) {
    if ((length & 4U) == 0) {
      local_48 = 0;
      pcVar2 = ptr + length;
      pcStack_18 = pcVar2;
      if ((length & 2U) != 0) {
        pcStack_18 = pcVar2 + -2;
        local_48 = (uint)*(ushort *)(pcVar2 + -2);
      }
      if ((length & 1U) != 0) {
        local_48 = local_48 * 0x100 + (uint)(byte)pcStack_18[-1];
      }
      ptr_local._4_4_ = local_48;
    }
    else {
      ptr_local._4_4_ = *(uint *)ptr;
    }
    return ptr_local._4_4_;
  }
  local_1c = length;
  pcStack_18 = ptr;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
             ,0x93,kFatal,(ostream *)&std::cerr);
  poVar1 = S2LogMessage::stream(&local_30);
  poVar1 = std::operator<<(poVar1,"Check failed: length >= 0 && length <= sizeof(T) ");
  S2LogMessageVoidify::operator&(&local_1d,poVar1);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

inline T GetUintWithLength(const char* ptr, int length) {
  static_assert(std::is_unsigned<T>::value, "Unsupported signed integer");
  static_assert(sizeof(T) & 0xe, "Unsupported integer length");
  S2_DCHECK(length >= 0 && length <= sizeof(T));

  // Note that the following code is faster than any of the following:
  //
  //  - A loop that repeatedly loads and shifts one byte.
  //  - memcpying "length" bytes to a local variable of type T.
  //  - A switch statement that handles each length optimally.
  //
  // The following code is slightly faster:
  //
  //   T mask = (length == 0) ? 0 : ~T{0} >> 8 * (sizeof(T) - length);
  //   return *reinterpret_cast<const T*>(ptr) & mask;
  //
  // However this technique is unsafe because in extremely rare cases it might
  // access out-of-bounds heap memory.  (This can only happen if "ptr" is
  // within (sizeof(T) - length) bytes of the end of a memory page and the
  // following page in the address space is unmapped.)

  if (length & sizeof(T)) {
    if (sizeof(T) == 8) return ABSL_INTERNAL_UNALIGNED_LOAD64(ptr);
    if (sizeof(T) == 4) return ABSL_INTERNAL_UNALIGNED_LOAD32(ptr);
    if (sizeof(T) == 2) return ABSL_INTERNAL_UNALIGNED_LOAD16(ptr);
    S2_DCHECK_EQ(sizeof(T), 1);
    return *ptr;
  }
  T x = 0;
  ptr += length;
  if (sizeof(T) > 4 && (length & 4)) {
    x = ABSL_INTERNAL_UNALIGNED_LOAD32(ptr -= sizeof(uint32));
  }
  if (sizeof(T) > 2 && (length & 2)) {
    x = (x << 16) + ABSL_INTERNAL_UNALIGNED_LOAD16(ptr -= sizeof(uint16));
  }
  if (sizeof(T) > 1 && (length & 1)) {
    x = (x << 8) + static_cast<uint8>(*--ptr);
  }
  return x;
}